

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage.cpp
# Opt level: O2

void test_combinations<wchar_t,char>(void)

{
  method_type how;
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  method_type in_ECX;
  allocator local_59;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_38;
  
  test_counter = test_counter + 1;
  booster::locale::conv::utf_to_utf<wchar_t,char>
            (&local_58,(conv *)anon_var_dwarf_86d5,(char *)0x0,in_ECX);
  bVar2 = std::operator==(&local_58,L"grüßen");
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  if (!bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x12e);
    poVar3 = std::operator<<(poVar3," (utf_to_utf<CharOut,CharIn>(in::ok())==out::ok())");
    std::endl<char,std::char_traits<char>>(poVar3);
    in_ECX = error_counter + stop;
    bVar2 = 0x14 < error_counter;
    error_counter = in_ECX;
    if (bVar2) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_58,"Error limits reached, stopping unit test",&local_59);
      booster::runtime_error::runtime_error(prVar4,(string *)&local_58);
      __cxa_throw(prVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  booster::locale::conv::utf_to_utf<wchar_t,char>
            (&local_38,(conv *)anon_var_dwarf_86e1,(char *)0x1,in_ECX);
  std::__cxx11::wstring::~wstring((wstring *)&local_38);
  poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x12f);
  poVar3 = std::operator<<(poVar3,
                           " (utf_to_utf<CharOut,CharIn>(in::bad(),booster::locale::conv::stop))");
  std::endl<char,std::char_traits<char>>(poVar3);
  how = error_counter + stop;
  if (error_counter < 0x15) {
    test_counter = test_counter + 1;
    error_counter = how;
    booster::locale::conv::utf_to_utf<wchar_t,char>
              (&local_58,(conv *)anon_var_dwarf_86e1,(char *)0x0,how);
    bVar2 = std::operator==(&local_58,L"grüßen");
    std::__cxx11::wstring::~wstring((wstring *)&local_58);
    if (!bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x130);
      poVar3 = std::operator<<(poVar3," (utf_to_utf<CharOut,CharIn>(in::bad())==out::ok())");
      std::endl<char,std::char_traits<char>>(poVar3);
      iVar1 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar2) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_58,"Error limits reached, stopping unit test",&local_59);
        booster::runtime_error::runtime_error(prVar4,(string *)&local_58);
        __cxa_throw(prVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    return;
  }
  error_counter = how;
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_58,"Error limits reached, stopping unit test",&local_59);
  booster::runtime_error::runtime_error(prVar4,(string *)&local_58);
  __cxa_throw(prVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void test_combinations()
{
    using booster::locale::conv::utf_to_utf;
    typedef utfutf<CharOut> out;
    typedef utfutf<CharIn> in;
    TEST( (utf_to_utf<CharOut,CharIn>(in::ok())==out::ok()) );
    TESTF( (utf_to_utf<CharOut,CharIn>(in::bad(),booster::locale::conv::stop)) );
    TEST( (utf_to_utf<CharOut,CharIn>(in::bad())==out::ok()) );
}